

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_AddLogicalCon_Test::TestBody(ProblemTest_AddLogicalCon_Test *this)

{
  LogicalConstant other;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
  other_00;
  LogicalExpr expr_00;
  bool bVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *message;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar2;
  LogicalExpr LVar3;
  int iVar4;
  int iVar5;
  MutLogicalCon MVar6;
  LogicalCon LVar7;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  LogicalExpr expr2;
  AssertionResult gtest_ar_2;
  LogicalCon ccon;
  LogicalCon con;
  AssertionResult gtest_ar_1;
  LogicalExpr expr;
  AssertionResult gtest_ar;
  Problem p;
  BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  type_conflict in_stack_fffffffffffffa54;
  undefined4 uVar8;
  ExprBase in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffa68;
  int line;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  undefined8 in_stack_fffffffffffffa78;
  Type TVar9;
  AssertHelper *in_stack_fffffffffffffa80;
  Message *in_stack_fffffffffffffac8;
  AssertHelper *in_stack_fffffffffffffad0;
  AssertionResult local_4e8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4d8;
  int local_4d0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4c8;
  int local_4c0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4b8;
  int local_4b0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4a8;
  int local_4a0;
  int local_488;
  undefined4 local_484;
  AssertionResult local_480;
  undefined8 local_470;
  undefined8 local_468;
  BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49> local_460;
  undefined8 local_458;
  ExprBase local_440;
  AssertionResult local_438;
  BasicProblem<mp::BasicProblemParams<int>_> *local_428;
  undefined8 uStack_420;
  BasicProblem<mp::BasicProblemParams<int>_> *local_418;
  int local_410;
  BasicProblem<mp::BasicProblemParams<int>_> *local_408;
  int local_400;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3f8;
  int local_3f0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3e8;
  int iStack_3e0;
  undefined4 uStack_3dc;
  int local_3c8;
  undefined4 local_3c4;
  AssertionResult local_3c0;
  undefined8 local_3b0;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_3a8;
  undefined8 local_3a0;
  int local_378;
  undefined4 local_374;
  AssertionResult local_370 [55];
  
  TVar9 = (Type)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  local_374 = 0;
  local_378 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_logical_cons
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12577c);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int *)in_stack_fffffffffffffa58.impl_,
             (int *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
             in_stack_fffffffffffffa48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa80);
    testing::AssertionResult::failure_message((AssertionResult *)0x12582b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa80,TVar9,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
               (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    testing::Message::~Message((Message *)0x12588e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1258e6);
  local_3a8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffa58.impl_,
                  SUB41((uint)in_stack_fffffffffffffa54 >> 0x18,0));
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffa64;
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffa60;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffa58.impl_,
             other,in_stack_fffffffffffffa54);
  local_3b0 = local_3a0;
  LVar3.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffa74;
  LVar3.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffa70;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(in_stack_fffffffffffffa68,LVar3);
  local_3c4 = 1;
  local_3c8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_logical_cons
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12596a);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int *)in_stack_fffffffffffffa58.impl_,
             (int *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa80);
    in_stack_fffffffffffffad0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x125a0d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa80,TVar9,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
               (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    testing::Message::~Message((Message *)0x125a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125ac8);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (int)((ulong)in_stack_fffffffffffffa58.impl_ >> 0x20));
  message = MVar6.
            super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_400 = MVar6.
              super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_408 = message;
  local_3f8 = message;
  local_3f0 = local_400;
  LVar7 = mp::BasicProblem::MutLogicalCon::operator_cast_to_BasicLogicalCon
                    ((MutLogicalCon *)0x125b2b);
  local_428 = LVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_410 = LVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  uStack_420 = CONCAT44(uStack_3dc,local_410);
  local_418 = local_428;
  local_3e8 = local_428;
  iStack_3e0 = local_410;
  local_440.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
               BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::expr(in_stack_fffffffffffffa48);
  testing::internal::EqHelper<false>::
  Compare<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffa58.impl_,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa80);
    testing::AssertionResult::failure_message((AssertionResult *)0x125c33);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa80,TVar9,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
               (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffad0,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    testing::Message::~Message((Message *)0x125c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125ce8);
  local_468 = local_3a0;
  local_460.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNot
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                  (LogicalExpr)in_stack_fffffffffffffa58.impl_);
  other_00.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffa64;
  other_00.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffa60;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffa58.impl_,
             other_00,in_stack_fffffffffffffa54);
  local_470 = local_458;
  expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffa74;
  expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffa70;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(in_stack_fffffffffffffa68,expr_00);
  local_484 = 2;
  local_488 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_logical_cons
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x125d79);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int *)in_stack_fffffffffffffa58.impl_,
             (int *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  iVar4 = (int)((ulong)in_stack_fffffffffffffa58.impl_ >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa80);
    in_stack_fffffffffffffa80 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x125e16);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa80,TVar9,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),iVar5,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffad0,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    testing::Message::~Message((Message *)0x125e73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125ecb);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),iVar4);
  pBVar2 = MVar6.
           super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar4 = MVar6.
          super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_4c8 = pBVar2;
  local_4c0 = iVar4;
  local_4b8 = pBVar2;
  local_4b0 = iVar4;
  LVar7 = mp::BasicProblem::MutLogicalCon::operator_cast_to_BasicLogicalCon
                    ((MutLogicalCon *)0x125f2b);
  TVar9 = (Type)((ulong)pBVar2 >> 0x20);
  pBVar2 = LVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
           problem_;
  iVar5 = LVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
  ;
  local_4d8 = pBVar2;
  local_4d0 = iVar5;
  local_4a8 = pBVar2;
  local_4a0 = iVar5;
  local_3e8 = pBVar2;
  iStack_3e0 = iVar5;
  LVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::expr(in_stack_fffffffffffffa48);
  testing::internal::EqHelper<false>::
  Compare<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)pBVar2,(char *)CONCAT44(iVar5,in_stack_fffffffffffffa60),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)LVar3.super_ExprBase.impl_,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  line = (int)((ulong)pBVar2 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa54);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa80);
    testing::AssertionResult::failure_message((AssertionResult *)0x126041);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa80,TVar9,(char *)CONCAT44(iVar4,in_stack_fffffffffffffa70),
               line,(char *)CONCAT44(iVar5,in_stack_fffffffffffffa60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffad0,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar8,in_stack_fffffffffffffa50));
    testing::Message::~Message((Message *)0x12609c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1260f1);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)CONCAT44(uVar8,in_stack_fffffffffffffa50)
            );
  return;
}

Assistant:

TEST(ProblemTest, AddLogicalCon) {
  Problem p;
  EXPECT_EQ(0, p.num_logical_cons());

  mp::LogicalExpr expr = p.MakeLogicalConstant(true);
  p.AddCon(expr);
  EXPECT_EQ(1, p.num_logical_cons());
  Problem::LogicalCon con = p.logical_con(0);
  const Problem::LogicalCon ccon = con;
  EXPECT_EQ(expr, ccon.expr());

  mp::LogicalExpr expr2 = p.MakeNot(expr);
  p.AddCon(expr2);
  EXPECT_EQ(2, p.num_logical_cons());
  con = p.logical_con(1);
  EXPECT_EQ(expr2, con.expr());
}